

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O0

QSslConfiguration __thiscall QNetworkAccessBackend::sslConfiguration(QNetworkAccessBackend *this)

{
  Int IVar1;
  undefined8 uVar2;
  QMessageLogger *in_RSI;
  QSslConfigurationPrivate *in_RDI;
  long in_FS_OFFSET;
  QSharedDataPointer<QSslConfigurationPrivate> this_00;
  QMessageLogger *this_01;
  char local_30 [32];
  QFlagsStorageHelper<QNetworkAccessBackend::SecurityFeature,_4> local_10;
  QFlagsStorageHelper<QNetworkAccessBackend::SecurityFeature,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       (totally_ordered_wrapper<QSslConfigurationPrivate_*>)
       (totally_ordered_wrapper<QSslConfigurationPrivate_*>)in_RDI;
  this_01 = in_RSI;
  local_10.super_QFlagsStorage<QNetworkAccessBackend::SecurityFeature>.i =
       (QFlagsStorage<QNetworkAccessBackend::SecurityFeature>)
       securityFeatures((QNetworkAccessBackend *)in_RDI);
  local_c.super_QFlagsStorage<QNetworkAccessBackend::SecurityFeature>.i =
       (QFlagsStorage<QNetworkAccessBackend::SecurityFeature>)
       QFlags<QNetworkAccessBackend::SecurityFeature>::operator&
                 ((QFlags<QNetworkAccessBackend::SecurityFeature> *)this_00.d.ptr,
                  (SecurityFeature)((ulong)in_RDI >> 0x20));
  IVar1 = ::QFlags::operator_cast_to_int((QFlags *)&local_c);
  if (IVar1 != 0) {
    QMessageLogger::QMessageLogger
              (this_01,(char *)in_RSI,(int)((ulong)this_00.d.ptr >> 0x20),(char *)in_RDI);
    (*(code *)**(undefined8 **)&in_RSI->context)();
    uVar2 = QMetaObject::className();
    QMessageLogger::warning
              (local_30,"Backend (%s) claiming to use TLS hasn\'t overridden sslConfiguration.",
               uVar2);
  }
  QSslConfiguration::QSslConfiguration((QSslConfiguration *)this_00.d.ptr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QSharedDataPointer<QSslConfigurationPrivate>)
           (QSharedDataPointer<QSslConfigurationPrivate>)this_00.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QSslConfiguration QNetworkAccessBackend::sslConfiguration() const
{
    if (securityFeatures() & SecurityFeature::TLS) {
        qWarning("Backend (%s) claiming to use TLS hasn't overridden sslConfiguration.",
                 metaObject()->className());
    }
    return {};
}